

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void mpc_ast_traverse_free(mpc_ast_trav_t **trav)

{
  mpc_ast_trav_t *pmVar1;
  mpc_ast_trav_t *__ptr;
  
  __ptr = *trav;
  while (__ptr != (mpc_ast_trav_t *)0x0) {
    pmVar1 = __ptr->parent;
    free(__ptr);
    *trav = pmVar1;
    __ptr = pmVar1;
  }
  return;
}

Assistant:

void mpc_ast_traverse_free(mpc_ast_trav_t **trav) {
  mpc_ast_trav_t *n_trav;

  /* Go through parents until all are free */
  while(*trav != NULL) {
      n_trav = (*trav)->parent;
      free(*trav);
      *trav = n_trav;
  }
}